

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O3

void Fra_ObjAddToFrontier(Fra_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  void **ppvVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                  ,0xd7,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  lVar3 = (long)pObj->Id;
  if (*(int *)(*(long *)((long)(pObj->field_5).pData + 0x98) + lVar3 * 4) == 0) {
    if (*(long *)(*(long *)((long)(pObj->field_5).pData + 0x90) + lVar3 * 8) != 0) {
      __assert_fail("Fra_ObjFaninVec(pObj) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                    ,0xdb,"void Fra_ObjAddToFrontier(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      *(int *)(*(long *)((long)(pObj->field_5).pData + 0x98) + lVar3 * 4) = iVar1;
      if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
        uVar2 = vFrontier->nSize;
        if (uVar2 == vFrontier->nCap) {
          if ((int)uVar2 < 0x10) {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vFrontier->pArray,0x80);
            }
            vFrontier->pArray = ppvVar4;
            vFrontier->nCap = 0x10;
          }
          else {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vFrontier->pArray,(ulong)uVar2 << 4);
            }
            vFrontier->pArray = ppvVar4;
            vFrontier->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar4 = vFrontier->pArray;
        }
        iVar1 = vFrontier->nSize;
        vFrontier->nSize = iVar1 + 1;
        ppvVar4[iVar1] = pObj;
      }
    }
  }
  return;
}

Assistant:

void Fra_ObjAddToFrontier( Fra_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Fra_ObjSatNum(pObj) )
        return;
    assert( Fra_ObjSatNum(pObj) == 0 );
    assert( Fra_ObjFaninVec(pObj) == NULL );
    if ( Aig_ObjIsConst1(pObj) )
        return;
    Fra_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}